

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,NumericForStatement *num_for,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  Guard g;
  Guard l;
  undefined8 local_9c;
  undefined1 local_94;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  Guard local_30;
  
  local_90._8_8_ = this->current_function_->current_loop_;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_manager;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:370:9)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  local_70._M_unused._M_object = this;
  local_70._8_8_ = num_for;
  Guard::Guard(&local_30,(function<void_()> *)&local_70,(function<void_()> *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  local_9c = 1;
  local_94 = 0;
  pSVar1 = (num_for->exp1_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  pSVar1 = (num_for->exp2_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_9c);
  pSVar1 = (num_for->exp3_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_9c);
  }
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:377:9)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  local_50._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_70,(function<void_()> *)&local_90,(function<void_()> *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  InsertName(this,(num_for->name_).field_0.str_);
  pSVar1 = (num_for->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Guard::~Guard((Guard *)&local_70);
  Guard::~Guard(&local_30);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(num_for);
        ExpVarData exp_var_data{ SemanticOp_Read };
        num_for->exp1_->Accept(this, &exp_var_data);
        num_for->exp2_->Accept(this, &exp_var_data);
        if (num_for->exp3_)
            num_for->exp3_->Accept(this, &exp_var_data);

        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
        InsertName(num_for->name_.str_);
        num_for->block_->Accept(this, nullptr);
    }